

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O3

void __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>
::supply(dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>
         *this)

{
  stats_consumer_t *in_RSI;
  
  dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
  ::supply((dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
            *)(this + -8),in_RSI);
  return;
}

Assistant:

virtual void
		supply( tp_stats::stats_consumer_t & consumer ) override
			{
				// Statics must be collected on locked object.
				std::lock_guard< std::mutex > lock( m_lock );

				consumer.set_thread_count( m_threads.size() );

				for( auto & t : m_threads )
					{
						using stats_t = so_5::stats::work_thread_activity_stats_t;

						WORK_THREAD & wt = *t;
						wt.take_activity_stats(
							[&wt, &consumer]( const stats_t & st ) {
								consumer.add_work_thread_activity( wt.thread_id(), st );
							} );
					}

				for( auto & q : m_cooperations )
					{
						auto & s = q.second;
						s.update_queue_stats();
						consumer.add_queue( s.m_queue_desc );
					}

				for( auto & a : m_agents )
					{
						auto & s = a.second;
						if( !s.cooperation_fifo() )
							{
								s.update_queue_stats();
								consumer.add_queue( s.m_queue_desc );
							}
					}
			}